

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O3

bool __thiscall
Js::SourceDynamicProfileManager::Serialize<Js::BufferWriter>
          (SourceDynamicProfileManager *this,BufferWriter *writer)

{
  Type *addr;
  BVFixed *this_00;
  DynamicProfileInfo *this_01;
  bool bVar1;
  bool bVar2;
  BVIndex BVar3;
  BVIndex BVar4;
  undefined8 in_RAX;
  size_t len;
  DynamicProfileInfo **ppDVar5;
  int index;
  undefined8 uStack_38;
  
  addr = &this->startupFunctions;
  this_00 = (this->cachedStartupFunctions).ptr;
  uStack_38 = in_RAX;
  if ((this->startupFunctions).ptr == (BVFixed *)0x0) {
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  else if (this_00 != (BVFixed *)0x0) {
    BVar3 = BVFixed::Length(this_00);
    BVar4 = BVFixed::Length(addr->ptr);
    if (BVar3 == BVar4) {
      BVFixed::Or((this->startupFunctions).ptr,(this->cachedStartupFunctions).ptr);
    }
  }
  if (addr->ptr == (BVFixed *)0x0) {
LAB_00b00750:
    bVar1 = true;
    if (0 < (this->dynamicProfileInfoMapSaving).count -
            (this->dynamicProfileInfoMapSaving).freeCount) {
      index = 0;
      do {
        ppDVar5 = JsUtil::
                  BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::GetValueAt(&this->dynamicProfileInfoMapSaving,index);
        this_01 = *ppDVar5;
        if (((this_01 != (DynamicProfileInfo *)0x0) && (this_01->hasFunctionBody == true)) &&
           (bVar2 = DynamicProfileInfo::Serialize<Js::BufferWriter>(this_01,writer), !bVar2))
        goto LAB_00b007a0;
        index = index + 1;
      } while (index < (this->dynamicProfileInfoMapSaving).count -
                       (this->dynamicProfileInfoMapSaving).freeCount);
    }
  }
  else {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_015962f8,DynamicProfilePhase);
    if (bVar1) {
      Output::Print(L"Saving: Startup functions bit vector:");
      BVFixed::Dump(addr->ptr);
    }
    BVar3 = BVFixed::Length(addr->ptr);
    len = BVFixed::GetAllocSize(BVar3);
    bVar1 = BufferWriter::WriteArray<char>(writer,(char *)addr->ptr,len);
    if (bVar1) {
      uStack_38 = CONCAT44((this->dynamicProfileInfoMapSaving).count -
                           (this->dynamicProfileInfoMapSaving).freeCount,(undefined4)uStack_38);
      bVar1 = BufferWriter::WriteArray<int_const>(writer,(int *)((long)&uStack_38 + 4),1);
      if (bVar1) goto LAB_00b00750;
    }
LAB_00b007a0:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
    SourceDynamicProfileManager::Serialize(T * writer)
    {
        // To simulate behavior of in memory profile cache - let's keep functions marked as executed if they were loaded
        // to be so from the profile - this helps with ensure inlined functions are marked as executed.
        if(!this->startupFunctions)
        {
            this->startupFunctions = const_cast<BVFixed*>(static_cast<const BVFixed*>(this->cachedStartupFunctions));
        }
        else if(cachedStartupFunctions && this->cachedStartupFunctions->Length() == this->startupFunctions->Length())
        {
            this->startupFunctions->Or(cachedStartupFunctions);
        }

        if(this->startupFunctions)
        {
#if DBG_DUMP
             if(Configuration::Global.flags.Dump.IsEnabled(DynamicProfilePhase))
            {
                Output::Print(_u("Saving: Startup functions bit vector:"));
                this->startupFunctions->Dump();
            }
#endif

            size_t bvSize = BVFixed::GetAllocSize(this->startupFunctions->Length()) ;
            if (!writer->WriteArray((char *)static_cast<BVFixed*>(this->startupFunctions), bvSize)
                || !writer->Write(this->dynamicProfileInfoMapSaving.Count()))
            {
                return false;
            }
        }

        for (int i = 0; i < this->dynamicProfileInfoMapSaving.Count(); i++)
        {
            DynamicProfileInfo * dynamicProfileInfo = this->dynamicProfileInfoMapSaving.GetValueAt(i);
            if (dynamicProfileInfo == nullptr || !dynamicProfileInfo->HasFunctionBody())
            {
                continue;
            }

            if (!dynamicProfileInfo->Serialize(writer))
            {
                return false;
            }
        }
        return true;
    }